

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateModuleGlobalVariableInformation(ExpressionTranslateContext *ctx)

{
  VariableData *variable_00;
  uint uVar1;
  VariableData **ppVVar2;
  ScopeData *pSVar3;
  VariableData *variable;
  uint i;
  ExpressionTranslateContext *ctx_local;
  
  PrintIndentedLine(ctx,"// Register globals");
  for (variable._4_4_ = 0; uVar1 = SmallArray<VariableData_*,_128U>::size(&ctx->ctx->variables),
      variable._4_4_ < uVar1; variable._4_4_ = variable._4_4_ + 1) {
    ppVVar2 = SmallArray<VariableData_*,_128U>::operator[](&ctx->ctx->variables,variable._4_4_);
    variable_00 = *ppVVar2;
    if ((((variable_00->isVmAlloca & 1U) == 0) && (variable_00->importModule == (ModuleData *)0x0))
       && ((variable_00->scope == ctx->ctx->globalScope ||
           ((variable_00->scope->ownerNamespace != (NamespaceData *)0x0 ||
            (pSVar3 = ExpressionContext::GlobalScopeFrom(ctx->ctx,variable_00->scope),
            pSVar3 != (ScopeData *)0x0)))))) {
      PrintIndent(ctx);
      Print(ctx,"__nullcRegisterGlobal((void*)&");
      TranslateVariableName(ctx,variable_00);
      Print(ctx,", __nullcTR[%d]);",(ulong)variable_00->type->typeIndex);
      PrintLine(ctx);
    }
  }
  PrintLine(ctx);
  return;
}

Assistant:

void TranslateModuleGlobalVariableInformation(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Register globals");

	for(unsigned int i = 0; i < ctx.ctx.variables.size(); i++)
	{
		VariableData *variable = ctx.ctx.variables[i];

		// Don't need variables allocated by intermediate vm compilation
		if(variable->isVmAlloca)
			continue;

		if(variable->importModule)
			continue;

		if(variable->scope == ctx.ctx.globalScope || variable->scope->ownerNamespace || ctx.ctx.GlobalScopeFrom(variable->scope))
		{
			PrintIndent(ctx);
			Print(ctx, "__nullcRegisterGlobal((void*)&");
			TranslateVariableName(ctx, variable);
			Print(ctx, ", __nullcTR[%d]);", variable->type->typeIndex);
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}